

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall xLearn::LibsvmParser::~LibsvmParser(LibsvmParser *this)

{
  void *in_RDI;
  
  ~LibsvmParser((LibsvmParser *)0x169d18);
  operator_delete(in_RDI);
  return;
}

Assistant:

~LibsvmParser() {  }